

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

real __thiscall fasttext::Model::hierarchicalSoftmax(Model *this,int32_t target,real lr)

{
  int32_t target_00;
  pointer pvVar1;
  long lVar2;
  const_reference label;
  pointer pvVar3;
  int32_t i;
  ulong __n;
  float fVar4;
  real rVar5;
  
  Vector::zero(&this->grad_);
  fVar4 = 0.0;
  __n = 0;
  pvVar1 = (this->codes).
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (this->paths).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + target;
  while( true ) {
    lVar2 = *(long *)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data;
    if ((ulong)((long)*(pointer *)
                       ((long)&(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data + 8) - lVar2 >> 2) <= __n) break;
    target_00 = *(int32_t *)(lVar2 + __n * 4);
    label = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar1 + target,__n);
    rVar5 = binaryLogistic(this,target_00,label,lr);
    __n = __n + 1;
    fVar4 = fVar4 + rVar5;
  }
  return fVar4;
}

Assistant:

real Model::hierarchicalSoftmax(int32_t target, real lr) {
	real loss = 0.0;
	grad_.zero();
	const std::vector<bool>& binaryCode = codes[target];
	const std::vector<int32_t>& pathToRoot = paths[target];
	for (int32_t i = 0; i < pathToRoot.size(); i++) {
		loss += binaryLogistic(pathToRoot[i], binaryCode[i], lr);
	}
	return loss;
}